

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

uint __thiscall TArray<FString,_FString>::Find(TArray<FString,_FString> *this,FString *item)

{
  bool bVar1;
  uint local_1c;
  uint i;
  FString *item_local;
  TArray<FString,_FString> *this_local;
  
  local_1c = 0;
  while ((local_1c < this->Count &&
         (bVar1 = FString::operator==(this->Array + local_1c,item), !bVar1))) {
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

unsigned int Find(const T& item) const
    {
        unsigned int i;
        for(i = 0;i < Count;++i)
        {
            if(Array[i] == item)
                break;
        }
        return i;
    }